

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.c
# Opt level: O3

void ht_registry_deinit(void)

{
  ulong uVar1;
  
  if (listeners_register.size != 0) {
    uVar1 = 0;
    do {
      ht_timeline_listener_container_unref
                ((HT_TimelineListenerContainer *)listeners_register.data[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < listeners_register.size);
  }
  ht_mutex_destroy(features_register_mutex);
  ht_mutex_destroy(event_klass_registry_register_mutex);
  ht_mutex_destroy(listeners_register_mutex);
  ht_bag_void_ptr_deinit(&listeners_register);
  ht_bag_void_ptr_deinit(&event_klass_register);
  return;
}

Assistant:

void
ht_registry_deinit(void)
{
    size_t i;
    for (i = 0; i < listeners_register.size; i++)
    {
        ht_timeline_listener_container_unref((HT_TimelineListenerContainer*)listeners_register.data[i]);
    }

    ht_mutex_destroy(features_register_mutex);
    ht_mutex_destroy(event_klass_registry_register_mutex);
    ht_mutex_destroy(listeners_register_mutex);
    ht_bag_void_ptr_deinit(&listeners_register);
    ht_bag_void_ptr_deinit(&event_klass_register);
}